

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void libcellml::fixComponentUnits(ModelPtr *model,ComponentPtr *component)

{
  string *__return_storage_ptr__;
  string *name;
  undefined8 uVar1;
  size_t sVar2;
  ulong uVar3;
  VariablePtr variable;
  UnitsPtr units;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  
  uVar3 = 0;
  __return_storage_ptr__ = (string *)(local_60 + 0x10);
  while( true ) {
    sVar2 = Component::variableCount
                      ((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (sVar2 <= uVar3) break;
    Component::variable((Component *)local_80,
                        (size_t)(component->
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    Variable::units((Variable *)__return_storage_ptr__);
    uVar1 = local_60._16_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
    if ((element_type *)uVar1 != (element_type *)0x0) {
      name = (string *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      Variable::units((Variable *)(local_80 + 0x10));
      NamedEntity::name_abi_cxx11_(__return_storage_ptr__,(NamedEntity *)local_80._16_8_);
      Model::units((Model *)local_60,name);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      if ((element_type *)local_60._0_8_ != (element_type *)0x0) {
        Variable::setUnits((Variable *)local_80._0_8_,(UnitsPtr *)local_60);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar2 <= uVar3) break;
    ComponentEntity::component
              ((ComponentEntity *)(local_60 + 0x10),
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    fixComponentUnits(model,(ComponentPtr *)(local_60 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void fixComponentUnits(const ModelPtr &model, const ComponentPtr &component)
{
    for (size_t v = 0; v < component->variableCount(); ++v) {
        auto variable = component->variable(v);
        if (variable->units() != nullptr) {
            // Find the units in the model and switch out.
            auto units = model->units(variable->units()->name());
            if (units != nullptr) {
                variable->setUnits(units);
            }
        }
    }
    for (size_t c = 0; c < component->componentCount(); ++c) {
        fixComponentUnits(model, component->component(c));
    }
}